

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermo.cpp
# Opt level: O2

void __thiscall
IO::Thermo::setUpperTemperatureCoefficients
          (Thermo *this,double ah1,double ah2,double ah3,double ah4,double ah5,double ah6,double ah7
          )

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer pdVar1;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  this_00 = &this->ah_;
  pdVar1 = (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar1;
  }
  local_40 = ah7;
  local_38 = ah6;
  local_30 = ah5;
  local_28 = ah4;
  local_20 = ah3;
  local_18 = ah2;
  local_10 = ah1;
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_10);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_18);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_20);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_28);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_30);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_38);
  std::vector<double,_std::allocator<double>_>::push_back(this_00,&local_40);
  return;
}

Assistant:

void IO::Thermo::setUpperTemperatureCoefficients(
        double ah1, double ah2, double ah3,
        double ah4, double ah5, double ah6,
        double ah7) {
    ah_.clear();
    ah_.push_back(ah1);
    ah_.push_back(ah2);
    ah_.push_back(ah3);
    ah_.push_back(ah4);
    ah_.push_back(ah5);
    ah_.push_back(ah6);
    ah_.push_back(ah7);
}